

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O0

void G_AddViewPitch(int look)

{
  bool bVar1;
  int local_c;
  int look_local;
  
  if (gamestate != GS_TITLELEVEL) {
    local_c = look << 0x10;
    if ((((&DAT_01ae70c8)[(long)consoleplayer * 0x2a0] != '\x01') &&
        (*(long *)(&DAT_01ae7190 + (long)consoleplayer * 0x2a0) != 0)) &&
       (0.0 < *(float *)(*(long *)(&DAT_01ae7190 + (long)consoleplayer * 0x2a0) + 0x598))) {
      local_c = (int)((float)local_c *
                     *(float *)(*(long *)(&DAT_01ae7190 + (long)consoleplayer * 0x2a0) + 0x598));
    }
    bVar1 = FLevelLocals::IsFreelookAllowed(&level);
    if (bVar1) {
      if (local_c < 1) {
        if (local_c < 0) {
          if (LocalViewPitch < -0x80000000 - local_c) {
            LocalViewPitch = -0x78000000;
          }
          else {
            LocalViewPitch = MAX<int>(LocalViewPitch + local_c,-0x78000000);
          }
        }
      }
      else if (0x7fffffff - local_c < LocalViewPitch) {
        LocalViewPitch = 0x78000000;
      }
      else {
        LocalViewPitch = MIN<int>(LocalViewPitch + local_c,0x78000000);
      }
    }
    else {
      LocalViewPitch = 0;
    }
    if (local_c != 0) {
      LocalKeyboardTurner = FBoolCVar::operator_cast_to_bool(&smooth_mouse);
    }
  }
  return;
}

Assistant:

void G_AddViewPitch (int look)
{
	if (gamestate == GS_TITLELEVEL)
	{
		return;
	}
	look <<= 16;
	if (players[consoleplayer].playerstate != PST_DEAD &&		// No adjustment while dead.
		players[consoleplayer].ReadyWeapon != NULL &&			// No adjustment if no weapon.
		players[consoleplayer].ReadyWeapon->FOVScale > 0)		// No adjustment if it is non-positive.
	{
		look = int(look * players[consoleplayer].ReadyWeapon->FOVScale);
	}
	if (!level.IsFreelookAllowed())
	{
		LocalViewPitch = 0;
	}
	else if (look > 0)
	{
		// Avoid overflowing
		if (LocalViewPitch > INT_MAX - look)
		{
			LocalViewPitch = 0x78000000;
		}
		else
		{
			LocalViewPitch = MIN(LocalViewPitch + look, 0x78000000);
		}
	}
	else if (look < 0)
	{
		// Avoid overflowing
		if (LocalViewPitch < INT_MIN - look)
		{
			LocalViewPitch = -0x78000000;
		}
		else
		{
			LocalViewPitch = MAX(LocalViewPitch + look, -0x78000000);
		}
	}
	if (look != 0)
	{
		LocalKeyboardTurner = smooth_mouse;
	}
}